

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  uint uVar22;
  undefined4 uVar23;
  int *piVar24;
  _func_int *p_Var25;
  size_t sVar26;
  size_t sVar27;
  Layer *pLVar28;
  long lVar29;
  long lVar30;
  void *pvVar31;
  ulong uVar32;
  int j;
  int iVar33;
  int iVar34;
  int _h;
  float *pfVar35;
  void *pvVar36;
  ulong uVar37;
  ulong uVar38;
  int iVar39;
  undefined4 *puVar40;
  int iVar41;
  long lVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  float *pfVar46;
  int iVar47;
  int iVar48;
  float *pfVar49;
  long lVar50;
  ParamDict pd;
  ulong local_978;
  void *local_950;
  undefined8 local_940;
  undefined1 local_938 [8];
  undefined8 uStack_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined8 auStack_900 [282];
  
  switch(*(undefined4 *)(&this->field_0xbc + (long)this->_vptr_Convolution_x86[-3])) {
  case 1:
    pLVar28 = create_layer(0x1a);
    this->activation = pLVar28;
    ParamDict::ParamDict((ParamDict *)local_938);
    (*this->activation->_vptr_Layer[2])(this->activation,(ParamDict *)local_938);
    lVar50 = 0x8c0;
    do {
      piVar24 = *(int **)((long)&uStack_930 + lVar50);
      if (piVar24 != (int *)0x0) {
        LOCK();
        *piVar24 = *piVar24 + -1;
        UNLOCK();
        if (*piVar24 == 0) {
          if (*(long **)((long)&local_918 + lVar50) == (long *)0x0) {
            if (*(void **)(local_938 + lVar50) != (void *)0x0) {
              free(*(void **)(local_938 + lVar50));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_918 + lVar50) + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&uStack_930 + lVar50 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(local_938 + lVar50) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&fStack_910 + lVar50) = (undefined1  [16])0x0;
      *(undefined8 *)((long)auStack_900 + lVar50) = 0;
      lVar50 = lVar50 + -0x48;
    } while (lVar50 != -0x40);
    break;
  case 2:
    pLVar28 = create_layer(0x1a);
    this->activation = pLVar28;
    ParamDict::ParamDict((ParamDict *)local_938);
    ParamDict::set((ParamDict *)local_938,0,
                   **(float **)(&this->field_0xc0 + (long)this->_vptr_Convolution_x86[-3]));
    (*this->activation->_vptr_Layer[2])(this->activation,local_938);
    lVar50 = 0x8c0;
    do {
      piVar24 = *(int **)((long)&uStack_930 + lVar50);
      if (piVar24 != (int *)0x0) {
        LOCK();
        *piVar24 = *piVar24 + -1;
        UNLOCK();
        if (*piVar24 == 0) {
          if (*(long **)((long)&local_918 + lVar50) == (long *)0x0) {
            if (*(void **)(local_938 + lVar50) != (void *)0x0) {
              free(*(void **)(local_938 + lVar50));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_918 + lVar50) + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&uStack_930 + lVar50 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(local_938 + lVar50) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&fStack_910 + lVar50) = (undefined1  [16])0x0;
      *(undefined8 *)((long)auStack_900 + lVar50) = 0;
      lVar50 = lVar50 + -0x48;
    } while (lVar50 != -0x40);
    break;
  case 3:
    pLVar28 = create_layer(0x36);
    this->activation = pLVar28;
    ParamDict::ParamDict((ParamDict *)local_938);
    ParamDict::set((ParamDict *)local_938,0,
                   **(float **)(&this->field_0xc0 + (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set((ParamDict *)local_938,1,
                   *(float *)(*(long *)(&this->field_0xc0 + (long)this->_vptr_Convolution_x86[-3]) +
                             4));
    (*this->activation->_vptr_Layer[2])(this->activation,local_938);
    lVar50 = 0x8c0;
    do {
      piVar24 = *(int **)((long)&uStack_930 + lVar50);
      if (piVar24 != (int *)0x0) {
        LOCK();
        *piVar24 = *piVar24 + -1;
        UNLOCK();
        if (*piVar24 == 0) {
          if (*(long **)((long)&local_918 + lVar50) == (long *)0x0) {
            if (*(void **)(local_938 + lVar50) != (void *)0x0) {
              free(*(void **)(local_938 + lVar50));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_918 + lVar50) + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&uStack_930 + lVar50 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(local_938 + lVar50) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&fStack_910 + lVar50) = (undefined1  [16])0x0;
      *(undefined8 *)((long)auStack_900 + lVar50) = 0;
      lVar50 = lVar50 + -0x48;
    } while (lVar50 != -0x40);
    break;
  case 4:
    pLVar28 = create_layer(0x1e);
    this->activation = pLVar28;
    ParamDict::ParamDict((ParamDict *)local_938);
    (*this->activation->_vptr_Layer[2])(this->activation,(ParamDict *)local_938);
    lVar50 = 0x8c0;
    do {
      piVar24 = *(int **)((long)&uStack_930 + lVar50);
      if (piVar24 != (int *)0x0) {
        LOCK();
        *piVar24 = *piVar24 + -1;
        UNLOCK();
        if (*piVar24 == 0) {
          if (*(long **)((long)&local_918 + lVar50) == (long *)0x0) {
            if (*(void **)(local_938 + lVar50) != (void *)0x0) {
              free(*(void **)(local_938 + lVar50));
            }
          }
          else {
            (**(code **)(**(long **)((long)&local_918 + lVar50) + 0x18))();
          }
        }
      }
      *(undefined1 (*) [16])((long)&uStack_930 + lVar50 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(local_938 + lVar50) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&fStack_910 + lVar50) = (undefined1  [16])0x0;
      *(undefined8 *)((long)auStack_900 + lVar50) = 0;
      lVar50 = lVar50 + -0x48;
    } while (lVar50 != -0x40);
  }
  pLVar28 = this->activation;
  if (pLVar28 != (Layer *)0x0) {
    (*pLVar28->_vptr_Layer[4])(pLVar28,opt);
  }
  this->use_winograd3x3 = false;
  if ((((((opt->use_winograd_convolution == true) &&
         (p_Var25 = this->_vptr_Convolution_x86[-3],
         *(int *)(p_Var25 + 0x2c + (long)&(this->weight_sgemm_data).data) == 3)) &&
        (*(int *)(p_Var25 + 0x30 + (long)&(this->weight_sgemm_data).data) == 3)) &&
       ((*(int *)(p_Var25 + 0x34 + (long)&(this->weight_sgemm_data).data) == 1 &&
        (*(int *)(p_Var25 + 0x38 + (long)&(this->weight_sgemm_data).data) == 1)))) &&
      ((*(int *)(p_Var25 + 0x3c + (long)&(this->weight_sgemm_data).data) == 1 &&
       ((*(int *)(p_Var25 +
                 (long)&(this->weight_3x3_winograd43_data).
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>) == 1 &&
        (0xf < *(int *)(p_Var25 + 0x28 + (long)&(this->weight_sgemm_data).data))))))) &&
     (0xf < (*(int *)(&this->field_0xb4 + (long)p_Var25) / 9) /
            *(int *)(p_Var25 + 0x28 + (long)&(this->weight_sgemm_data).data))) {
    this->use_winograd3x3 = true;
    p_Var25 = this->_vptr_Convolution_x86[-3];
    uVar22 = *(uint *)(p_Var25 + 0x28 + (long)&(this->weight_sgemm_data).data);
    uVar32 = (long)(*(int *)(&this->field_0xb4 + (long)p_Var25) / 9) / (long)(int)uVar22;
    uVar37 = uVar32 & 0xffffffff;
    iVar34 = (int)uVar32;
    if ((&this->field_0x1c8)[(long)p_Var25] == '\x01') {
      Mat::create(&this->weight_3x3_winograd23_data,0x24,iVar34,uVar22,2,(Allocator *)0x0);
      if (0 < (int)uVar22) {
        lVar50 = *(long *)(&this->field_0x100 + (long)p_Var25);
        iVar41 = (this->weight_3x3_winograd23_data).w;
        local_950 = (this->weight_3x3_winograd23_data).data;
        sVar26 = (this->weight_3x3_winograd23_data).elemsize;
        local_940 = (this->weight_3x3_winograd23_data).cstep * sVar26;
        local_978 = 0;
        do {
          if (0 < iVar34) {
            lVar29 = iVar34 * 9 * (int)local_978 + lVar50;
            uVar32 = 0;
            pvVar36 = local_950;
            do {
              lVar30 = uVar32 * 9;
              cVar10 = *(char *)(lVar29 + lVar30);
              cVar11 = *(char *)(lVar29 + 1 + lVar30);
              cVar12 = *(char *)(lVar29 + 2 + lVar30);
              cVar13 = *(char *)(lVar29 + 3 + lVar30);
              cVar14 = *(char *)(lVar29 + 4 + lVar30);
              cVar15 = *(char *)(lVar29 + 5 + lVar30);
              cVar16 = *(char *)(lVar29 + 6 + lVar30);
              cVar17 = *(char *)(lVar29 + 7 + lVar30);
              cVar18 = *(char *)(lVar29 + 8 + lVar30);
              lVar30 = 4;
              do {
                sVar19 = *(short *)(&UNK_001722dc + lVar30);
                sVar20 = *(short *)(&UNK_001722de + lVar30);
                sVar21 = *(short *)((long)&DAT_001722e0 + lVar30);
                *(short *)((long)&local_940 + lVar30 + 4) =
                     sVar21 * cVar12 + sVar20 * cVar11 + sVar19 * cVar10;
                *(short *)((long)&local_940 + lVar30 + 6) =
                     sVar21 * cVar15 + sVar20 * cVar14 + sVar19 * cVar13;
                *(short *)(local_938 + lVar30) = sVar21 * cVar18 + sVar20 * cVar17 + sVar19 * cVar16
                ;
                lVar30 = lVar30 + 6;
              } while (lVar30 != 0x28);
              lVar30 = 0;
              pvVar31 = pvVar36;
              do {
                sVar19 = *(short *)(local_938 + lVar30 * 6);
                uVar23 = *(undefined4 *)(local_938 + lVar30 * 6 + 2);
                puVar40 = &DAT_001722e2;
                lVar42 = 0;
                do {
                  *(short *)((long)pvVar31 + lVar42 * 2) =
                       (short)((uint)*puVar40 >> 0x10) * (short)((uint)uVar23 >> 0x10) +
                       (short)*puVar40 * (short)uVar23 + *(short *)((long)puVar40 + -2) * sVar19;
                  lVar42 = lVar42 + 1;
                  puVar40 = (undefined4 *)((long)puVar40 + 6);
                } while (lVar42 != 6);
                lVar30 = lVar30 + 1;
                pvVar31 = (void *)((long)pvVar31 + 0xc);
              } while (lVar30 != 6);
              uVar32 = uVar32 + 1;
              pvVar36 = (void *)((long)pvVar36 + (long)iVar41 * sVar26);
            } while (uVar32 != uVar37);
          }
          local_978 = local_978 + 1;
          local_950 = (void *)((long)local_950 + local_940);
        } while (local_978 != uVar22);
      }
    }
    else {
      Mat::create(&this->weight_3x3_winograd23_data,0x10,iVar34,uVar22,4,(Allocator *)0x0);
      if (0 < (int)uVar22) {
        lVar50 = *(long *)(&this->field_0x100 + (long)p_Var25);
        iVar41 = (this->weight_3x3_winograd23_data).w;
        pfVar35 = (float *)(this->weight_3x3_winograd23_data).data;
        sVar26 = (this->weight_3x3_winograd23_data).elemsize;
        sVar27 = (this->weight_3x3_winograd23_data).cstep;
        uVar32 = 0;
        do {
          if (0 < iVar34) {
            lVar29 = lVar50 + (long)(iVar34 * 9 * (int)uVar32) * 4;
            uVar38 = 0;
            pfVar46 = pfVar35;
            do {
              fVar1 = *(float *)(lVar29 + uVar38 * 0x24);
              fVar2 = *(float *)(lVar29 + 4 + uVar38 * 0x24);
              fVar3 = *(float *)(lVar29 + 8 + uVar38 * 0x24);
              fVar4 = *(float *)(lVar29 + 0xc + uVar38 * 0x24);
              fVar5 = *(float *)(lVar29 + 0x10 + uVar38 * 0x24);
              fVar6 = *(float *)(lVar29 + 0x14 + uVar38 * 0x24);
              fVar7 = *(float *)(lVar29 + 0x18 + uVar38 * 0x24);
              fVar8 = *(float *)(lVar29 + 0x1c + uVar38 * 0x24);
              fVar9 = *(float *)(lVar29 + 0x20 + uVar38 * 0x24);
              local_928 = fVar6 * 0.5 + fVar5 * 0.5 + fVar4 * 0.5;
              fStack_924 = fVar9 * 0.5 + fVar8 * 0.5 + fVar7 * 0.5;
              fStack_920 = fVar3 * 0.5 + fVar2 * -0.5 + fVar1 * 0.5;
              fStack_91c = fVar6 * 0.5 + fVar5 * -0.5 + fVar4 * 0.5;
              local_938._0_4_ = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 1.0;
              local_938._4_4_ = fVar6 * 0.0 + fVar5 * 0.0 + fVar4 * 1.0;
              uStack_930._0_4_ = fVar9 * 0.0 + fVar8 * 0.0 + fVar7 * 1.0;
              uStack_930._4_4_ = fVar3 * 0.5 + fVar2 * 0.5 + fVar1 * 0.5;
              local_918 = fVar9 * 0.5 + fVar8 * -0.5 + fVar7 * 0.5;
              fStack_914 = fVar3 * 1.0 + fVar2 * 0.0 + fVar1 * 0.0;
              fStack_910 = fVar6 * 1.0 + fVar5 * 0.0 + fVar4 * 0.0;
              fStack_90c = fVar9 * 1.0 + fVar8 * 0.0 + fVar7 * 0.0;
              lVar30 = 8;
              pfVar49 = pfVar46;
              do {
                fVar1 = *(float *)((long)&local_940 + lVar30);
                fVar2 = *(float *)((long)&local_940 + lVar30 + 4);
                fVar3 = *(float *)(local_938 + lVar30);
                *pfVar49 = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 1.0;
                pfVar49[1] = fVar3 * 0.5 + fVar2 * 0.5 + fVar1 * 0.5;
                pfVar49[2] = fVar3 * 0.5 + fVar2 * -0.5 + fVar1 * 0.5;
                pfVar49[3] = fVar3 * 1.0 + fVar2 * 0.0 + fVar1 * 0.0;
                lVar30 = lVar30 + 0xc;
                pfVar49 = pfVar49 + 4;
              } while (lVar30 != 0x38);
              uVar38 = uVar38 + 1;
              pfVar46 = (float *)((long)pfVar46 + (long)iVar41 * sVar26);
            } while (uVar38 != uVar37);
          }
          uVar32 = uVar32 + 1;
          pfVar35 = (float *)((long)pfVar35 + sVar27 * sVar26);
        } while (uVar32 != uVar22);
      }
    }
  }
  p_Var25 = this->_vptr_Convolution_x86[-3];
  if ((&this->field_0x1c8)[(long)p_Var25] == '\0') {
    iVar39 = *(int *)(p_Var25 + 0x2c + (long)&(this->weight_sgemm_data).data) *
             *(int *)(p_Var25 + 0x30 + (long)&(this->weight_sgemm_data).data);
    uVar32 = (long)*(int *)(&this->field_0xb4 + (long)p_Var25) / (long)iVar39;
    iVar34 = *(int *)(p_Var25 + 0x28 + (long)&(this->weight_sgemm_data).data);
    uVar37 = (ulong)iVar34;
    lVar50 = *(long *)(&this->field_0x100 + (long)p_Var25);
    iVar41 = iVar34 + 3;
    if (-1 < (long)uVar37) {
      iVar41 = iVar34;
    }
    iVar48 = 0;
    _h = (int)((long)((ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 | uVar32 & 0xffffffff) /
              (long)iVar34);
    Mat::create(&this->weight_sgemm_data,iVar39 * 4,_h,iVar34 + (iVar41 >> 2) * -3,4,
                (Allocator *)0x0);
    uVar32 = uVar37 & 0xfffffffffffffffc;
    if (0 < iVar34 >> 2) {
      iVar33 = _h * iVar39;
      pvVar36 = (this->weight_sgemm_data).data;
      sVar26 = (this->weight_sgemm_data).elemsize;
      sVar27 = (this->weight_sgemm_data).cstep;
      iVar43 = iVar33 * 3;
      iVar41 = iVar33 * 4;
      iVar45 = iVar33 * 2;
      uVar38 = 0;
      iVar47 = iVar33;
      do {
        if (0 < iVar33) {
          puVar40 = (undefined4 *)(sVar26 * sVar27 * uVar38 + (long)pvVar36);
          lVar29 = 0;
          do {
            *puVar40 = *(undefined4 *)(lVar50 + (long)iVar48 * 4 + lVar29 * 4);
            puVar40[1] = *(undefined4 *)(lVar50 + (long)iVar47 * 4 + lVar29 * 4);
            puVar40[2] = *(undefined4 *)(lVar50 + (long)iVar45 * 4 + lVar29 * 4);
            puVar40[3] = *(undefined4 *)(lVar50 + (long)iVar43 * 4 + lVar29 * 4);
            lVar29 = lVar29 + 1;
            puVar40 = puVar40 + 4;
          } while (iVar33 != (int)lVar29);
        }
        uVar38 = uVar38 + 1;
        iVar43 = iVar43 + iVar41;
        iVar45 = iVar45 + iVar41;
        iVar47 = iVar47 + iVar41;
        iVar48 = iVar48 + iVar41;
      } while (uVar38 != (uint)(iVar34 >> 2));
    }
    if ((int)uVar32 != iVar34) {
      iVar34 = _h * iVar39;
      pvVar36 = (this->weight_sgemm_data).data;
      sVar26 = (this->weight_sgemm_data).elemsize;
      sVar27 = (this->weight_sgemm_data).cstep;
      iVar41 = ((uint)(uVar37 >> 2) & 0x3fffffff) * _h * iVar39 * 4;
      do {
        if (0 < iVar34) {
          uVar22 = (uint)uVar32;
          uVar44 = uVar22 + 3;
          if (-1 < (int)uVar22) {
            uVar44 = uVar22;
          }
          lVar29 = 0;
          do {
            *(undefined4 *)
             ((long)pvVar36 +
             lVar29 * 4 +
             (long)(int)(((int)uVar44 >> 2) + (uVar22 - (uVar44 & 0xfffffffc))) * sVar26 * sVar27) =
                 *(undefined4 *)(lVar50 + (long)iVar41 * 4 + lVar29 * 4);
            lVar29 = lVar29 + 1;
          } while (iVar34 != (int)lVar29);
        }
        uVar32 = uVar32 + 1;
        iVar41 = iVar41 + iVar34;
      } while ((long)uVar32 < (long)uVar37);
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// min
        pd.set(1, activation_params[1]);// max
        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    use_winograd3x3 = false;

    if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        int num_input = weight_data_size / 9 / num_output;
        // winograd is slow on small channel count
        if(num_input >= 16 && num_output >= 16)
            use_winograd3x3 = true;
    }           

    if (use_winograd3x3)
    {
        int num_input = weight_data_size / 9 / num_output;

        if (use_int8_inference)
            // conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
            conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
        else
            conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
//             conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_3x3_winograd43_data, num_input, num_output);
    }

    if (use_int8_inference == false)
    {
        int kernel_size = kernel_w * kernel_h;
        int num_input = weight_data_size / kernel_size / num_output;

        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }       

    return 0;
}